

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

Col_Word Col_NewList(size_t length,Col_Word *elements)

{
  Col_Word CVar1;
  Col_Word right;
  
  if (length == 0) {
    CVar1 = 0x14;
  }
  else {
    if (elements != (Col_Word *)0x0) {
      CVar1 = Col_NewVector(length,elements);
      return CVar1;
    }
    if (length >> 0x3b != 0) {
      CVar1 = Col_NewList(length >> 1,(Col_Word *)0x0);
      right = Col_NewList(length - (length >> 1),(Col_Word *)0x0);
      CVar1 = Col_ConcatLists(CVar1,right);
      return CVar1;
    }
    CVar1 = length << 5 | 0x14;
  }
  return CVar1;
}

Assistant:

Col_Word
Col_NewList(
    size_t length,              /*!< Length of below array. */
    const Col_Word * elements)  /*!< Array of words to populate list with. If
                                     NULL, build a void list (i.e. whose
                                     elements are all nil). */
{
    size_t half=0;              /* Index of the split point. */

    if (length == 0) {
        /*
         * Empty list.
         */

        return WORD_LIST_EMPTY;
    }

    if (!elements) {
        /*
         * Void list.
         */

        if (length <= VOIDLIST_MAX_LENGTH) {
            return WORD_VOIDLIST_NEW(length);
        }

        /*
         * Length is too long to fit within an immediate value. Split.
         */

        half = length/2;
        return Col_ConcatLists(Col_NewList(half, NULL), Col_NewList(length-half,
                NULL));
    }

    return Col_NewVector(length, elements);
}